

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  MessageLite *pMVar1;
  Extension *pEVar2;
  MessageLite *extraout_RAX;
  MessageLite *extraout_RAX_00;
  MessageLite *extraout_RAX_01;
  MessageLite *extraout_RAX_02;
  MessageLite *extraout_RAX_03;
  MessageLite *extraout_RAX_04;
  MessageLite *extraout_RAX_05;
  MessageLite *extraout_RAX_06;
  MessageLite *extraout_RAX_07;
  int key;
  ExtensionSet *this_01;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  ExtensionSet EStack_50;
  undefined1 auStack_38 [16];
  
  this_01 = (ExtensionSet *)auStack_38;
  key = (int)auStack_38;
  EStack_50.map_.flat = (KeyValue *)0x25ac9e;
  pVar3 = Insert(this,number);
  pEVar2 = pVar3.first;
  pEVar2->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar2->is_repeated == false) goto LAB_0025ad27;
    if (0xed < (byte)(pEVar2->type - 0x13)) {
      this_01 = (ExtensionSet *)
                (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar2->type * 4);
      if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar2->type * 4) == 10) {
        this_00 = pEVar2->field_0;
        goto LAB_0025ad0a;
      }
      goto LAB_0025ad3f;
    }
  }
  else {
    pEVar2->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      EStack_50.map_.flat = (KeyValue *)0x25ad27;
      AddMessage((ExtensionSet *)auStack_38);
LAB_0025ad27:
      EStack_50.map_.flat = (KeyValue *)0x25ad2f;
      AddMessage((ExtensionSet *)auStack_38);
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) == 10) {
      pEVar2->is_repeated = true;
      pEVar2->field_0xa = pEVar2->field_0xa | 1;
      EStack_50.map_.flat = (KeyValue *)0x25acdc;
      this_00 = (anon_union_8_9_fdc4a54a_for_Extension_0)
                Arena::
                CreateArenaCompatible<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                          (this->arena_);
      pEVar2->field_0 = this_00;
LAB_0025ad0a:
      pMVar1 = RepeatedPtrFieldBase::AddMessage((RepeatedPtrFieldBase *)this_00,prototype);
      return pMVar1;
    }
    EStack_50.map_.flat = (KeyValue *)0x25ad37;
    AddMessage();
  }
  EStack_50.map_.flat = (KeyValue *)0x25ad3f;
  AddMessage((ExtensionSet *)auStack_38);
LAB_0025ad3f:
  EStack_50.map_.flat = (KeyValue *)0x25ad47;
  AddMessage();
  EStack_50.map_ = (AllocatedData)prototype;
  pEVar2 = FindOrNull(this_01,key);
  if (pEVar2 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&EStack_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x361,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (&EStack_50,0x25,"Index out-of-bounds (field is empty).");
  }
  else {
    if (pEVar2->is_repeated == false) {
      RemoveLast(&EStack_50);
    }
    else if (0xed < (byte)(pEVar2->type - 0x13)) {
      switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar2->type * 4)) {
      case 1:
      case 8:
        RepeatedField<int>::RemoveLast((RepeatedField<int> *)pEVar2->field_0);
        return extraout_RAX;
      case 2:
        RepeatedField<long>::RemoveLast((RepeatedField<long> *)pEVar2->field_0);
        return extraout_RAX_02;
      case 3:
        RepeatedField<unsigned_int>::RemoveLast((RepeatedField<unsigned_int> *)pEVar2->field_0);
        return extraout_RAX_03;
      case 4:
        RepeatedField<unsigned_long>::RemoveLast((RepeatedField<unsigned_long> *)pEVar2->field_0);
        return extraout_RAX_00;
      case 5:
        RepeatedField<double>::RemoveLast((RepeatedField<double> *)pEVar2->field_0);
        return extraout_RAX_05;
      case 6:
        RepeatedField<float>::RemoveLast((RepeatedField<float> *)pEVar2->field_0);
        return extraout_RAX_06;
      case 7:
        RepeatedField<bool>::RemoveLast((RepeatedField<bool> *)pEVar2->field_0);
        return extraout_RAX_04;
      case 9:
        RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  ((RepeatedPtrFieldBase *)pEVar2->field_0);
        return extraout_RAX_07;
      case 10:
        RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                  ((RepeatedPtrFieldBase *)pEVar2->field_0);
        return extraout_RAX_01;
      default:
        return (MessageLite *)pEVar2;
      }
    }
    RemoveLast(&EStack_50);
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&EStack_50)
  ;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  return reinterpret_cast<internal::RepeatedPtrFieldBase*>(
             extension->ptr.repeated_message_value)
      ->AddMessage(&prototype);
}